

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpxpes_parser.cc
# Opt level: O2

bool __thiscall libwebm::VpxPesParser::Open(VpxPesParser *this,string *pes_file)

{
  int iVar1;
  uint64_t __n;
  bool bVar2;
  FilePtr file;
  uchar local_21;
  _Head_base<0UL,__IO_FILE_*,_false> local_20;
  
  __n = GetFileSize(pes_file);
  *(uint64_t *)(this + 0x38) = __n;
  if (__n != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0x58),__n);
    local_20._M_head_impl = (_IO_FILE *)fopen((pes_file->_M_dataplus)._M_p,"rb");
    while (iVar1 = fgetc((FILE *)local_20._M_head_impl), iVar1 != -1) {
      local_21 = (uchar)iVar1;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0x58),&local_21);
    }
    iVar1 = feof((FILE *)local_20._M_head_impl);
    if (((iVar1 == 0) || (iVar1 = ferror((FILE *)local_20._M_head_impl), iVar1 != 0)) ||
       (*(long *)(this + 0x38) != *(long *)(this + 0x60) - *(long *)(this + 0x58))) {
      bVar2 = false;
    }
    else {
      *(undefined8 *)(this + 0x70) = 0;
      *(undefined4 *)(this + 0x78) = 0;
      bVar2 = true;
    }
    std::unique_ptr<_IO_FILE,_libwebm::FILEDeleter>::~unique_ptr
              ((unique_ptr<_IO_FILE,_libwebm::FILEDeleter> *)&local_20);
    return bVar2;
  }
  return false;
}

Assistant:

bool VpxPesParser::Open(const std::string& pes_file) {
  pes_file_size_ = static_cast<size_t>(libwebm::GetFileSize(pes_file));
  if (pes_file_size_ <= 0)
    return false;
  pes_file_data_.reserve(static_cast<size_t>(pes_file_size_));
  libwebm::FilePtr file = libwebm::FilePtr(std::fopen(pes_file.c_str(), "rb"),
                                           libwebm::FILEDeleter());
  int byte;
  while ((byte = fgetc(file.get())) != EOF) {
    pes_file_data_.push_back(static_cast<std::uint8_t>(byte));
  }

  if (!feof(file.get()) || ferror(file.get()) ||
      pes_file_size_ != pes_file_data_.size()) {
    return false;
  }

  read_pos_ = 0;
  parse_state_ = kFindStartCode;
  return true;
}